

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

ostream * operator<<(ostream *out,IMLE *imle_obj)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"-----------------------  Parameters  ----",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  IMLE::Param::display(&imle_obj->param,out);
  IMLE::modelDisplay(imle_obj,out);
  return out;
}

Assistant:

IMLE_CLASS_TEMPLATE
std::ostream &operator<<(std::ostream &out, IMLE_base const &imle_obj)
{
    out << "-----------------------  Parameters  ----" << std::endl;
    imle_obj.displayParameters(out);
    imle_obj.modelDisplay(out);

    return out;
}